

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

void __thiscall
Assimp::IFC::anon_unknown_9::Conic::Conic(Conic *this,IfcConic *entity,ConversionData *conv)

{
  IfcMatrix4 trafo;
  IfcMatrix4 local_90;
  
  (this->super_Curve).base_entity = &entity->super_IfcCurve;
  (this->super_Curve).conv = conv;
  (this->super_Curve)._vptr_Curve = (_func_int **)&PTR__Curve_007f80d8;
  (this->location).x = 0.0;
  (this->location).y = 0.0;
  (this->location).z = 0.0;
  this->p[0].x = 0.0;
  this->p[0].y = 0.0;
  this->p[0].z = 0.0;
  this->p[1].x = 0.0;
  this->p[1].y = 0.0;
  this->p[1].z = 0.0;
  this->p[2].x = 0.0;
  this->p[2].y = 0.0;
  this->p[2].z = 0.0;
  local_90.a1 = 1.0;
  local_90.a2 = 0.0;
  local_90.a3 = 0.0;
  local_90.a4 = 0.0;
  local_90.b1 = 0.0;
  local_90.b2 = 1.0;
  local_90.b3 = 0.0;
  local_90.b4 = 0.0;
  local_90.c1 = 0.0;
  local_90.c2 = 0.0;
  local_90.c3 = 1.0;
  local_90.c4 = 0.0;
  local_90.d1 = 0.0;
  local_90.d2 = 0.0;
  local_90.d3 = 0.0;
  local_90.d4 = 1.0;
  ConvertAxisPlacement(&local_90,*(IfcAxis2Placement **)&(entity->super_IfcCurve).field_0x40,conv);
  (this->location).x = local_90.a4;
  (this->location).y = local_90.b4;
  (this->location).z = local_90.c4;
  this->p[0].x = local_90.a1;
  this->p[0].y = local_90.b1;
  this->p[0].z = local_90.c1;
  this->p[1].x = local_90.a2;
  this->p[1].y = local_90.b2;
  this->p[1].z = local_90.c2;
  this->p[2].x = local_90.a3;
  this->p[2].y = local_90.b3;
  this->p[2].z = local_90.c3;
  return;
}

Assistant:

Conic(const Schema_2x3::IfcConic& entity, ConversionData& conv)
    : Curve(entity,conv) {
        IfcMatrix4 trafo;
        ConvertAxisPlacement(trafo,*entity.Position,conv);

        // for convenience, extract the matrix rows
        location = IfcVector3(trafo.a4,trafo.b4,trafo.c4);
        p[0] = IfcVector3(trafo.a1,trafo.b1,trafo.c1);
        p[1] = IfcVector3(trafo.a2,trafo.b2,trafo.c2);
        p[2] = IfcVector3(trafo.a3,trafo.b3,trafo.c3);
    }